

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O0

bool tinyobj::exportGroupsToShape
               (shape_t *shape,PrimGroup *prim_group,
               vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *tags,int material_id,
               string *name,bool triangulate,vector<float,_std::allocator<float>_> *v)

{
  float testx;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  long lVar5;
  const_reference pvVar6;
  vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *pvVar7;
  ulong uVar8;
  reference pvVar9;
  reference pvVar10;
  vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_> *pvVar11;
  value_type *pvVar12;
  size_type sVar13;
  vector<tinyobj::face_t,_std::allocator<tinyobj::face_t>_> *in_RSI;
  string *in_RDI;
  string *in_R8;
  byte in_R9B;
  double dVar14;
  vector<float,_std::allocator<float>_> *in_stack_00000008;
  index_t idx_3;
  vertex_index_t *vi_2;
  size_t j_1;
  size_t i_2;
  index_t idx_2;
  vertex_index_t *vi_1;
  size_t j;
  size_t i_1;
  index_t idx_1;
  size_t k_3;
  index_t idx2_1;
  index_t idx1_1;
  index_t idx0_1;
  size_t removed_vert_index;
  index_t idx2;
  index_t idx1;
  index_t idx0;
  real_t ty;
  real_t tx;
  size_t ovi;
  size_t idx;
  size_t otherVert;
  bool overlap;
  real_t cross;
  real_t e1y_1;
  real_t e1x_1;
  real_t e0y_1;
  real_t e0x_1;
  size_t vi;
  size_t k_2;
  size_t previousRemainingVertices;
  size_t remainingIterations;
  real_t vy [3];
  real_t vx [3];
  vertex_index_t ind [3];
  size_t guess_vert;
  face_t remainingFace;
  real_t v1y_1;
  real_t v1x_1;
  real_t v0y_1;
  real_t v0x_1;
  size_t vi1_1;
  size_t vi0_1;
  size_t k_1;
  real_t area;
  real_t epsilon;
  real_t cz;
  real_t cy;
  real_t cx;
  real_t e1z;
  real_t e1y;
  real_t e1x;
  real_t e0z;
  real_t e0y;
  real_t e0x;
  real_t v2z;
  real_t v2y;
  real_t v2x;
  real_t v1z;
  real_t v1y;
  real_t v1x;
  real_t v0z;
  real_t v0y;
  real_t v0x;
  size_t vi2;
  size_t vi1;
  size_t vi0;
  size_t k;
  size_t axes [2];
  vertex_index_t i2;
  vertex_index_t i1;
  vertex_index_t i0;
  size_t npolys;
  face_t *face;
  size_t i;
  face_t *in_stack_fffffffffffffc68;
  PrimGroup *in_stack_fffffffffffffc70;
  value_type *in_stack_fffffffffffffc78;
  value_type *__x;
  string *in_stack_fffffffffffffc80;
  vertex_index_t *local_310;
  vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *in_stack_fffffffffffffd08;
  vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *in_stack_fffffffffffffd10;
  size_type local_2b0;
  value_type *local_2a8;
  ulong local_288;
  ulong local_280;
  size_type local_268;
  size_type local_238;
  ulong local_1f0;
  ulong local_1c8;
  size_type local_1c0;
  size_type local_1b8;
  float local_1ac [4];
  float local_19c;
  float local_198;
  vertex_index_t local_188 [4];
  ulong local_158;
  vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_> local_148;
  float local_130;
  float local_12c;
  value_type local_128;
  value_type local_124;
  long local_120;
  long local_118;
  ulong local_110;
  float local_108;
  float local_104;
  float local_100;
  float local_fc;
  float local_f8;
  float local_f4;
  float local_f0;
  float local_ec;
  float local_e8;
  float local_e4;
  float local_e0;
  float local_dc;
  float local_d8;
  value_type local_d4;
  value_type local_d0;
  value_type local_cc;
  value_type local_c8;
  value_type local_c4;
  value_type local_c0;
  value_type local_bc;
  long local_b8;
  long local_b0;
  long local_a8;
  ulong local_a0;
  long local_98;
  long local_90;
  undefined8 local_80;
  int local_78;
  vertex_index_t local_70;
  undefined8 local_60;
  int local_58;
  size_type local_50;
  const_reference local_48;
  ulong local_40;
  byte local_31;
  string *local_30;
  vector<tinyobj::face_t,_std::allocator<tinyobj::face_t>_> *local_18;
  string *local_10;
  bool local_1;
  
  local_31 = in_R9B & 1;
  local_30 = in_R8;
  local_18 = in_RSI;
  local_10 = in_RDI;
  bVar1 = PrimGroup::IsEmpty(in_stack_fffffffffffffc70);
  if (bVar1) {
    local_1 = false;
  }
  else {
    std::__cxx11::string::operator=(local_10,local_30);
    bVar1 = std::vector<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>::empty
                      ((vector<tinyobj::face_t,_std::allocator<tinyobj::face_t>_> *)
                       in_stack_fffffffffffffc80);
    if (!bVar1) {
      for (local_40 = 0; uVar8 = local_40,
          sVar3 = std::vector<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>::size(local_18),
          uVar8 < sVar3; local_40 = local_40 + 1) {
        local_48 = std::vector<tinyobj::face_t,_std::allocator<tinyobj::face_t>_>::operator[]
                             (local_18,local_40);
        local_50 = std::vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
                   size(&local_48->vertex_indices);
        if (2 < local_50) {
          pvVar4 = std::vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
                   operator[](&local_48->vertex_indices,0);
          local_60._0_4_ = pvVar4->v_idx;
          local_60._4_4_ = pvVar4->vt_idx;
          local_58 = pvVar4->vn_idx;
          vertex_index_t::vertex_index_t(&local_70,-1);
          pvVar4 = std::vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
                   operator[](&local_48->vertex_indices,1);
          local_80._0_4_ = pvVar4->v_idx;
          local_80._4_4_ = pvVar4->vt_idx;
          local_78 = pvVar4->vn_idx;
          if ((local_31 & 1) == 0) {
            for (local_268 = 0; local_268 < local_50; local_268 = local_268 + 1) {
              std::vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
              operator[](&local_48->vertex_indices,local_268);
              std::vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
              operator[](&local_48->vertex_indices,local_268);
              std::vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
              operator[](&local_48->vertex_indices,local_268);
              std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
                        ((vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> *)
                         in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
            }
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffffc70,(value_type_conflict5 *)in_stack_fffffffffffffc68);
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc80,
                       &in_stack_fffffffffffffc78->vertex_index);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       in_stack_fffffffffffffc80,(value_type_conflict2 *)in_stack_fffffffffffffc78);
          }
          else {
            local_98 = 1;
            local_90 = 2;
            for (local_a0 = 0; local_a0 < local_50; local_a0 = local_a0 + 1) {
              pvVar4 = std::
                       vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
                       operator[](&local_48->vertex_indices,local_a0 % local_50);
              local_60._0_4_ = pvVar4->v_idx;
              local_60._4_4_ = pvVar4->vt_idx;
              local_58 = pvVar4->vn_idx;
              pvVar4 = std::
                       vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
                       operator[](&local_48->vertex_indices,(local_a0 + 1) % local_50);
              local_70.v_idx = pvVar4->v_idx;
              local_70.vt_idx = pvVar4->vt_idx;
              local_70.vn_idx = pvVar4->vn_idx;
              pvVar4 = std::
                       vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
                       operator[](&local_48->vertex_indices,(local_a0 + 2) % local_50);
              local_80._0_4_ = pvVar4->v_idx;
              local_80._4_4_ = pvVar4->vt_idx;
              local_78 = pvVar4->vn_idx;
              local_a8 = (long)(int)local_60;
              local_b0 = (long)local_70.v_idx;
              local_b8 = (long)(int)(undefined4)local_80;
              lVar5 = local_a8 * 3;
              sVar3 = std::vector<float,_std::allocator<float>_>::size(in_stack_00000008);
              if (((lVar5 + 2U < sVar3) &&
                  (lVar5 = local_b0 * 3,
                  sVar3 = std::vector<float,_std::allocator<float>_>::size(in_stack_00000008),
                  lVar5 + 2U < sVar3)) &&
                 (lVar5 = local_b8 * 3,
                 sVar3 = std::vector<float,_std::allocator<float>_>::size(in_stack_00000008),
                 lVar5 + 2U < sVar3)) {
                pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                                   (in_stack_00000008,local_a8 * 3);
                local_bc = *pvVar6;
                pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                                   (in_stack_00000008,local_a8 * 3 + 1);
                local_c0 = *pvVar6;
                pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                                   (in_stack_00000008,local_a8 * 3 + 2);
                local_c4 = *pvVar6;
                pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                                   (in_stack_00000008,local_b0 * 3);
                local_c8 = *pvVar6;
                pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                                   (in_stack_00000008,local_b0 * 3 + 1);
                local_cc = *pvVar6;
                pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                                   (in_stack_00000008,local_b0 * 3 + 2);
                local_d0 = *pvVar6;
                pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                                   (in_stack_00000008,local_b8 * 3);
                local_d4 = *pvVar6;
                pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                                   (in_stack_00000008,local_b8 * 3 + 1);
                local_d8 = *pvVar6;
                pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                                   (in_stack_00000008,local_b8 * 3 + 2);
                local_dc = *pvVar6;
                local_e0 = local_c8 - local_bc;
                local_e4 = local_cc - local_c0;
                local_e8 = local_d0 - local_c4;
                local_ec = local_d4 - local_c8;
                local_f0 = local_d8 - local_cc;
                local_f4 = local_dc - local_d0;
                dVar14 = std::fabs((double)(ulong)(uint)(local_e4 * local_f4 +
                                                        -(local_e8 * local_f0)));
                local_f8 = SUB84(dVar14,0);
                dVar14 = std::fabs((double)(ulong)(uint)(local_e8 * local_ec +
                                                        -(local_e0 * local_f4)));
                local_fc = SUB84(dVar14,0);
                dVar14 = std::fabs((double)(ulong)(uint)(local_e0 * local_f0 +
                                                        -(local_e4 * local_ec)));
                local_100 = SUB84(dVar14,0);
                local_104 = std::numeric_limits<float>::epsilon();
                if (((1.1920929e-07 < local_f8) || (1.1920929e-07 < local_fc)) ||
                   (1.1920929e-07 < local_100)) {
                  if (((local_f8 <= local_fc) || (local_f8 <= local_100)) &&
                     ((local_98 = 0, local_f8 < local_100 && (local_fc < local_100)))) {
                    local_90 = 1;
                  }
                  break;
                }
              }
            }
            local_108 = 0.0;
            for (local_110 = 0; local_110 < local_50; local_110 = local_110 + 1) {
              pvVar4 = std::
                       vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
                       operator[](&local_48->vertex_indices,local_110 % local_50);
              local_60._0_4_ = pvVar4->v_idx;
              local_60._4_4_ = pvVar4->vt_idx;
              local_58 = pvVar4->vn_idx;
              pvVar4 = std::
                       vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
                       operator[](&local_48->vertex_indices,(local_110 + 1) % local_50);
              local_70.v_idx = pvVar4->v_idx;
              local_70.vt_idx = pvVar4->vt_idx;
              local_70.vn_idx = pvVar4->vn_idx;
              local_118 = (long)(int)local_60;
              local_120 = (long)local_70.v_idx;
              in_stack_fffffffffffffd10 =
                   (vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *)
                   (local_118 * 3 + local_98);
              pvVar7 = (vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *)
                       std::vector<float,_std::allocator<float>_>::size(in_stack_00000008);
              if (in_stack_fffffffffffffd10 < pvVar7) {
                in_stack_fffffffffffffd08 =
                     (vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *)
                     (local_118 * 3 + local_90);
                pvVar7 = (vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> *)
                         std::vector<float,_std::allocator<float>_>::size(in_stack_00000008);
                if (((in_stack_fffffffffffffd08 < pvVar7) &&
                    (uVar8 = local_120 * 3 + local_98,
                    sVar3 = std::vector<float,_std::allocator<float>_>::size(in_stack_00000008),
                    uVar8 < sVar3)) &&
                   (uVar8 = local_120 * 3 + local_90,
                   sVar3 = std::vector<float,_std::allocator<float>_>::size(in_stack_00000008),
                   uVar8 < sVar3)) {
                  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                                     (in_stack_00000008,local_118 * 3 + local_98);
                  local_124 = *pvVar6;
                  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                                     (in_stack_00000008,local_118 * 3 + local_90);
                  local_128 = *pvVar6;
                  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                                     (in_stack_00000008,local_120 * 3 + local_98);
                  local_12c = *pvVar6;
                  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                                     (in_stack_00000008,local_120 * 3 + local_90);
                  local_130 = *pvVar6;
                  local_108 = (local_124 * local_130 + -(local_128 * local_12c)) * 0.5 + local_108;
                }
              }
            }
            face_t::face_t((face_t *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
            local_158 = 0;
            local_310 = local_188;
            do {
              vertex_index_t::vertex_index_t(local_310);
              local_310 = local_310 + 1;
            } while (local_310 != local_188 + 3);
            local_1b8 = std::
                        vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
                        size(&local_48->vertex_indices);
            local_1c0 = std::
                        vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
                        size(&local_148);
            while (sVar3 = std::
                           vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                           ::size(&local_148), 3 < sVar3 && local_1b8 != 0) {
              local_50 = std::
                         vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
                         size(&local_148);
              if (local_50 <= local_158) {
                local_158 = local_158 - local_50;
              }
              sVar3 = local_50;
              sVar13 = local_50;
              if (local_1c0 == local_50) {
                sVar3 = local_1c0;
                sVar13 = local_1b8 - 1;
              }
              local_1b8 = sVar13;
              local_1c0 = sVar3;
              for (local_1c8 = 0; local_1c8 < 3; local_1c8 = local_1c8 + 1) {
                pvVar10 = std::
                          vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                          ::operator[](&local_148,(local_158 + local_1c8) % local_50);
                iVar2 = pvVar10->vt_idx;
                local_188[local_1c8].v_idx = pvVar10->v_idx;
                local_188[local_1c8].vt_idx = iVar2;
                local_188[local_1c8].vn_idx = pvVar10->vn_idx;
                lVar5 = (long)local_188[local_1c8].v_idx;
                uVar8 = lVar5 * 3 + local_98;
                sVar3 = std::vector<float,_std::allocator<float>_>::size(in_stack_00000008);
                if ((uVar8 < sVar3) &&
                   (uVar8 = lVar5 * 3 + local_90,
                   sVar3 = std::vector<float,_std::allocator<float>_>::size(in_stack_00000008),
                   uVar8 < sVar3)) {
                  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                                     (in_stack_00000008,lVar5 * 3 + local_98);
                  local_1ac[local_1c8 + 3] = *pvVar6;
                  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                                     (in_stack_00000008,lVar5 * 3 + local_90);
                  local_1ac[local_1c8] = *pvVar6;
                }
                else {
                  local_1ac[local_1c8 + 3] = 0.0;
                  local_1ac[local_1c8] = 0.0;
                }
              }
              if (0.0 <= ((local_19c - local_1ac[3]) * (local_1ac[2] - local_1ac[1]) +
                         -((local_1ac[1] - local_1ac[0]) * (local_198 - local_19c))) * local_108) {
                bVar1 = false;
                for (local_1f0 = 3; local_1f0 < local_50; local_1f0 = local_1f0 + 1) {
                  uVar8 = (local_158 + local_1f0) % local_50;
                  sVar3 = std::
                          vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                          ::size(&local_148);
                  if (uVar8 < sVar3) {
                    pvVar10 = std::
                              vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                              ::operator[](&local_148,uVar8);
                    lVar5 = (long)pvVar10->v_idx;
                    uVar8 = lVar5 * 3 + local_98;
                    sVar3 = std::vector<float,_std::allocator<float>_>::size(in_stack_00000008);
                    if ((uVar8 < sVar3) &&
                       (uVar8 = lVar5 * 3 + local_90,
                       sVar3 = std::vector<float,_std::allocator<float>_>::size(in_stack_00000008),
                       uVar8 < sVar3)) {
                      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                                         (in_stack_00000008,lVar5 * 3 + local_98);
                      testx = *pvVar6;
                      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                                         (in_stack_00000008,lVar5 * 3 + local_90);
                      iVar2 = pnpoly<float>(3,local_1ac + 3,local_1ac,testx,*pvVar6);
                      if (iVar2 != 0) {
                        bVar1 = true;
                        break;
                      }
                    }
                  }
                }
                if (bVar1) {
                  local_158 = local_158 + 1;
                }
                else {
                  std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
                            ((vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> *)
                             in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
                  std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
                            ((vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> *)
                             in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
                  std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
                            ((vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> *)
                             in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             in_stack_fffffffffffffc70,
                             (value_type_conflict5 *)in_stack_fffffffffffffc68);
                  std::vector<int,_std::allocator<int>_>::push_back
                            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc80,
                             &in_stack_fffffffffffffc78->vertex_index);
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             in_stack_fffffffffffffc80,
                             (value_type_conflict2 *)in_stack_fffffffffffffc78);
                  for (local_238 = (local_158 + 1) % local_50; local_238 + 1 < local_50;
                      local_238 = local_238 + 1) {
                    pvVar10 = std::
                              vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                              ::operator[](&local_148,local_238 + 1);
                    pvVar9 = std::
                             vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                             ::operator[](&local_148,local_238);
                    iVar2 = pvVar10->vt_idx;
                    pvVar9->v_idx = pvVar10->v_idx;
                    pvVar9->vt_idx = iVar2;
                    pvVar9->vn_idx = pvVar10->vn_idx;
                  }
                  std::vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
                  pop_back((vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>
                            *)0x1aee5b);
                }
              }
              else {
                local_158 = local_158 + 1;
              }
            }
            sVar3 = std::vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
                    size(&local_148);
            if (sVar3 == 3) {
              pvVar10 = std::
                        vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
                        operator[](&local_148,0);
              local_58 = pvVar10->vn_idx;
              local_60._0_4_ = pvVar10->v_idx;
              local_60._4_4_ = pvVar10->vt_idx;
              pvVar10 = std::
                        vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
                        operator[](&local_148,1);
              local_70.vn_idx = pvVar10->vn_idx;
              local_70.v_idx = pvVar10->v_idx;
              local_70.vt_idx = pvVar10->vt_idx;
              pvVar10 = std::
                        vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
                        operator[](&local_148,2);
              local_78 = pvVar10->vn_idx;
              local_80._0_4_ = pvVar10->v_idx;
              local_80._4_4_ = pvVar10->vt_idx;
              std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
                        ((vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> *)
                         in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
              std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
                        ((vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> *)
                         in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
              std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
                        ((vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> *)
                         in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         in_stack_fffffffffffffc70,(value_type_conflict5 *)in_stack_fffffffffffffc68
                        );
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc80,
                         &in_stack_fffffffffffffc78->vertex_index);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         in_stack_fffffffffffffc80,(value_type_conflict2 *)in_stack_fffffffffffffc78
                        );
            }
            face_t::~face_t((face_t *)0x1af025);
          }
        }
      }
      std::vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>::operator=
                (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    }
    bVar1 = std::vector<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>::empty
                      ((vector<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_> *)
                       in_stack_fffffffffffffc80);
    if (!bVar1) {
      for (local_280 = 0;
          sVar3 = std::vector<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>::size
                            ((vector<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_> *)
                             (local_18 + 1)), local_280 < sVar3; local_280 = local_280 + 1) {
        local_288 = 0;
        while( true ) {
          pvVar11 = &std::vector<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>::operator[]
                               ((vector<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_> *)
                                (local_18 + 1),local_280)->vertex_indices;
          sVar3 = std::vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
                  size(pvVar11);
          if (sVar3 <= local_288) break;
          pvVar11 = &std::vector<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>::operator[]
                               ((vector<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_> *)
                                (local_18 + 1),local_280)->vertex_indices;
          std::vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::operator[]
                    (pvVar11,local_288);
          std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
                    ((vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> *)
                     in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
          local_288 = local_288 + 1;
        }
        in_stack_fffffffffffffc80 = local_10 + 0xb0;
        pvVar11 = &std::vector<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_>::operator[]
                             ((vector<tinyobj::__line_t,_std::allocator<tinyobj::__line_t>_> *)
                              (local_18 + 1),local_280)->vertex_indices;
        std::vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::size
                  (pvVar11);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc70,
                   (value_type_conflict1 *)in_stack_fffffffffffffc68);
      }
    }
    bVar1 = std::vector<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>::empty
                      ((vector<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_> *)
                       in_stack_fffffffffffffc80);
    if (!bVar1) {
      local_2a8 = (value_type *)0x0;
      while (__x = local_2a8,
            pvVar12 = (value_type *)
                      std::vector<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>::size
                                ((vector<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>
                                  *)(local_18 + 2)), __x < pvVar12) {
        local_2b0 = 0;
        while( true ) {
          sVar3 = local_2b0;
          pvVar11 = &std::vector<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>::
                     operator[]((vector<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_> *
                                )(local_18 + 2),(size_type)local_2a8)->vertex_indices;
          sVar13 = std::vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::
                   size(pvVar11);
          if (sVar13 <= sVar3) break;
          pvVar11 = &std::vector<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_>::
                     operator[]((vector<tinyobj::__points_t,_std::allocator<tinyobj::__points_t>_> *
                                )(local_18 + 2),(size_type)local_2a8)->vertex_indices;
          std::vector<tinyobj::vertex_index_t,_std::allocator<tinyobj::vertex_index_t>_>::operator[]
                    (pvVar11,local_2b0);
          std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back
                    ((vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> *)
                     in_stack_fffffffffffffc80,__x);
          local_2b0 = local_2b0 + 1;
        }
        local_2a8 = (value_type *)((long)&local_2a8->vertex_index + 1);
      }
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

static bool exportGroupsToShape(shape_t *shape, const PrimGroup &prim_group,
                                const std::vector<tag_t> &tags,
                                const int material_id, const std::string &name,
                                bool triangulate,
                                const std::vector<real_t> &v) {
  if (prim_group.IsEmpty()) {
    return false;
  }

  shape->name = name;

  // polygon
  if (!prim_group.faceGroup.empty()) {
    // Flatten vertices and indices
    for (size_t i = 0; i < prim_group.faceGroup.size(); i++) {
      const face_t &face = prim_group.faceGroup[i];

      size_t npolys = face.vertex_indices.size();

      if (npolys < 3) {
        // Face must have 3+ vertices.
        continue;
      }

      vertex_index_t i0 = face.vertex_indices[0];
      vertex_index_t i1(-1);
      vertex_index_t i2 = face.vertex_indices[1];

      if (triangulate) {
        // find the two axes to work in
        size_t axes[2] = {1, 2};
        for (size_t k = 0; k < npolys; ++k) {
          i0 = face.vertex_indices[(k + 0) % npolys];
          i1 = face.vertex_indices[(k + 1) % npolys];
          i2 = face.vertex_indices[(k + 2) % npolys];
          size_t vi0 = size_t(i0.v_idx);
          size_t vi1 = size_t(i1.v_idx);
          size_t vi2 = size_t(i2.v_idx);

          if (((3 * vi0 + 2) >= v.size()) || ((3 * vi1 + 2) >= v.size()) ||
              ((3 * vi2 + 2) >= v.size())) {
            // Invalid triangle.
            // FIXME(syoyo): Is it ok to simply skip this invalid triangle?
            continue;
          }
          real_t v0x = v[vi0 * 3 + 0];
          real_t v0y = v[vi0 * 3 + 1];
          real_t v0z = v[vi0 * 3 + 2];
          real_t v1x = v[vi1 * 3 + 0];
          real_t v1y = v[vi1 * 3 + 1];
          real_t v1z = v[vi1 * 3 + 2];
          real_t v2x = v[vi2 * 3 + 0];
          real_t v2y = v[vi2 * 3 + 1];
          real_t v2z = v[vi2 * 3 + 2];
          real_t e0x = v1x - v0x;
          real_t e0y = v1y - v0y;
          real_t e0z = v1z - v0z;
          real_t e1x = v2x - v1x;
          real_t e1y = v2y - v1y;
          real_t e1z = v2z - v1z;
          real_t cx = std::fabs(e0y * e1z - e0z * e1y);
          real_t cy = std::fabs(e0z * e1x - e0x * e1z);
          real_t cz = std::fabs(e0x * e1y - e0y * e1x);
          const real_t epsilon = std::numeric_limits<real_t>::epsilon();
          if (cx > epsilon || cy > epsilon || cz > epsilon) {
            // found a corner
            if (cx > cy && cx > cz) {
            } else {
              axes[0] = 0;
              if (cz > cx && cz > cy) axes[1] = 1;
            }
            break;
          }
        }

        real_t area = 0;
        for (size_t k = 0; k < npolys; ++k) {
          i0 = face.vertex_indices[(k + 0) % npolys];
          i1 = face.vertex_indices[(k + 1) % npolys];
          size_t vi0 = size_t(i0.v_idx);
          size_t vi1 = size_t(i1.v_idx);
          if (((vi0 * 3 + axes[0]) >= v.size()) ||
              ((vi0 * 3 + axes[1]) >= v.size()) ||
              ((vi1 * 3 + axes[0]) >= v.size()) ||
              ((vi1 * 3 + axes[1]) >= v.size())) {
            // Invalid index.
            continue;
          }
          real_t v0x = v[vi0 * 3 + axes[0]];
          real_t v0y = v[vi0 * 3 + axes[1]];
          real_t v1x = v[vi1 * 3 + axes[0]];
          real_t v1y = v[vi1 * 3 + axes[1]];
          area += (v0x * v1y - v0y * v1x) * static_cast<real_t>(0.5);
        }

        face_t remainingFace = face;  // copy
        size_t guess_vert = 0;
        vertex_index_t ind[3];
        real_t vx[3];
        real_t vy[3];

        // How many iterations can we do without decreasing the remaining
        // vertices.
        size_t remainingIterations = face.vertex_indices.size();
        size_t previousRemainingVertices = remainingFace.vertex_indices.size();

        while (remainingFace.vertex_indices.size() > 3 &&
               remainingIterations > 0) {
          npolys = remainingFace.vertex_indices.size();
          if (guess_vert >= npolys) {
            guess_vert -= npolys;
          }

          if (previousRemainingVertices != npolys) {
            // The number of remaining vertices decreased. Reset counters.
            previousRemainingVertices = npolys;
            remainingIterations = npolys;
          } else {
            // We didn't consume a vertex on previous iteration, reduce the
            // available iterations.
            remainingIterations--;
          }

          for (size_t k = 0; k < 3; k++) {
            ind[k] = remainingFace.vertex_indices[(guess_vert + k) % npolys];
            size_t vi = size_t(ind[k].v_idx);
            if (((vi * 3 + axes[0]) >= v.size()) ||
                ((vi * 3 + axes[1]) >= v.size())) {
              // ???
              vx[k] = static_cast<real_t>(0.0);
              vy[k] = static_cast<real_t>(0.0);
            } else {
              vx[k] = v[vi * 3 + axes[0]];
              vy[k] = v[vi * 3 + axes[1]];
            }
          }
          real_t e0x = vx[1] - vx[0];
          real_t e0y = vy[1] - vy[0];
          real_t e1x = vx[2] - vx[1];
          real_t e1y = vy[2] - vy[1];
          real_t cross = e0x * e1y - e0y * e1x;
          // if an internal angle
          if (cross * area < static_cast<real_t>(0.0)) {
            guess_vert += 1;
            continue;
          }

          // check all other verts in case they are inside this triangle
          bool overlap = false;
          for (size_t otherVert = 3; otherVert < npolys; ++otherVert) {
            size_t idx = (guess_vert + otherVert) % npolys;

            if (idx >= remainingFace.vertex_indices.size()) {
              // ???
              continue;
            }

            size_t ovi = size_t(remainingFace.vertex_indices[idx].v_idx);

            if (((ovi * 3 + axes[0]) >= v.size()) ||
                ((ovi * 3 + axes[1]) >= v.size())) {
              // ???
              continue;
            }
            real_t tx = v[ovi * 3 + axes[0]];
            real_t ty = v[ovi * 3 + axes[1]];
            if (pnpoly(3, vx, vy, tx, ty)) {
              overlap = true;
              break;
            }
          }

          if (overlap) {
            guess_vert += 1;
            continue;
          }

          // this triangle is an ear
          {
            index_t idx0, idx1, idx2;
            idx0.vertex_index = ind[0].v_idx;
            idx0.normal_index = ind[0].vn_idx;
            idx0.texcoord_index = ind[0].vt_idx;
            idx1.vertex_index = ind[1].v_idx;
            idx1.normal_index = ind[1].vn_idx;
            idx1.texcoord_index = ind[1].vt_idx;
            idx2.vertex_index = ind[2].v_idx;
            idx2.normal_index = ind[2].vn_idx;
            idx2.texcoord_index = ind[2].vt_idx;

            shape->mesh.indices.push_back(idx0);
            shape->mesh.indices.push_back(idx1);
            shape->mesh.indices.push_back(idx2);

            shape->mesh.num_face_vertices.push_back(3);
            shape->mesh.material_ids.push_back(material_id);
            shape->mesh.smoothing_group_ids.push_back(face.smoothing_group_id);
          }

          // remove v1 from the list
          size_t removed_vert_index = (guess_vert + 1) % npolys;
          while (removed_vert_index + 1 < npolys) {
            remainingFace.vertex_indices[removed_vert_index] =
                remainingFace.vertex_indices[removed_vert_index + 1];
            removed_vert_index += 1;
          }
          remainingFace.vertex_indices.pop_back();
        }

        if (remainingFace.vertex_indices.size() == 3) {
          i0 = remainingFace.vertex_indices[0];
          i1 = remainingFace.vertex_indices[1];
          i2 = remainingFace.vertex_indices[2];
          {
            index_t idx0, idx1, idx2;
            idx0.vertex_index = i0.v_idx;
            idx0.normal_index = i0.vn_idx;
            idx0.texcoord_index = i0.vt_idx;
            idx1.vertex_index = i1.v_idx;
            idx1.normal_index = i1.vn_idx;
            idx1.texcoord_index = i1.vt_idx;
            idx2.vertex_index = i2.v_idx;
            idx2.normal_index = i2.vn_idx;
            idx2.texcoord_index = i2.vt_idx;

            shape->mesh.indices.push_back(idx0);
            shape->mesh.indices.push_back(idx1);
            shape->mesh.indices.push_back(idx2);

            shape->mesh.num_face_vertices.push_back(3);
            shape->mesh.material_ids.push_back(material_id);
            shape->mesh.smoothing_group_ids.push_back(face.smoothing_group_id);
          }
        }
      } else {
        for (size_t k = 0; k < npolys; k++) {
          index_t idx;
          idx.vertex_index = face.vertex_indices[k].v_idx;
          idx.normal_index = face.vertex_indices[k].vn_idx;
          idx.texcoord_index = face.vertex_indices[k].vt_idx;
          shape->mesh.indices.push_back(idx);
        }

        shape->mesh.num_face_vertices.push_back(
            static_cast<unsigned char>(npolys));
        shape->mesh.material_ids.push_back(material_id);  // per face
        shape->mesh.smoothing_group_ids.push_back(
            face.smoothing_group_id);  // per face
      }
    }

    shape->mesh.tags = tags;
  }

  // line
  if (!prim_group.lineGroup.empty()) {
    // Flatten indices
    for (size_t i = 0; i < prim_group.lineGroup.size(); i++) {
      for (size_t j = 0; j < prim_group.lineGroup[i].vertex_indices.size();
           j++) {
        const vertex_index_t &vi = prim_group.lineGroup[i].vertex_indices[j];

        index_t idx;
        idx.vertex_index = vi.v_idx;
        idx.normal_index = vi.vn_idx;
        idx.texcoord_index = vi.vt_idx;

        shape->lines.indices.push_back(idx);
      }

      shape->lines.num_line_vertices.push_back(
          int(prim_group.lineGroup[i].vertex_indices.size()));
    }
  }

  // points
  if (!prim_group.pointsGroup.empty()) {
    // Flatten & convert indices
    for (size_t i = 0; i < prim_group.pointsGroup.size(); i++) {
      for (size_t j = 0; j < prim_group.pointsGroup[i].vertex_indices.size();
           j++) {
        const vertex_index_t &vi = prim_group.pointsGroup[i].vertex_indices[j];

        index_t idx;
        idx.vertex_index = vi.v_idx;
        idx.normal_index = vi.vn_idx;
        idx.texcoord_index = vi.vt_idx;

        shape->points.indices.push_back(idx);
      }
    }
  }

  return true;
}